

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_LdSlotPrimitive<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>,_SIMDValue>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  Var pvVar1;
  _SIMDValue *buffer;
  OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pvVar1 = GetNonVarReg(this,(uint)playout->Instance);
  SetRegRaw<_SIMDValue>
            (this,(uint)playout->Value,
             (AsmJsSIMDValue)
             *(anon_union_16_9_4d7543c8_for__SIMDValue_0 *)
              ((long)pvVar1 + (ulong)playout->SlotIndex * 0x10));
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdSlotPrimitive(const unaligned T* playout)
    {
        T2* buffer = (T2*)GetNonVarReg(playout->Instance);
        SetRegRaw<T2>(playout->Value, buffer[playout->SlotIndex]);
    }